

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 202_happyNum.cpp
# Opt level: O2

int sqsum(int n)

{
  int iVar1;
  
  iVar1 = 0;
  for (; n != 0; n = n / 10) {
    iVar1 = (int)((double)iVar1 + (double)(n % 10) * (double)(n % 10));
  }
  return iVar1;
}

Assistant:

int sqsum(int n)
{
    int s = 0;
    while (n)
    {
        s += pow(n%10,2);
        n/=10;
    }
    return s;
}